

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

CheckerInstanceSymbol *
slang::ast::CheckerInstanceSymbol::createInvalid(CheckerSymbol *checker,uint32_t depth)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  reference ppAVar5;
  allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  *paVar6;
  equal_to<const_slang::ast::Symbol_*> *this;
  raw_key_type *__y;
  CheckerDeclarationSyntax *args;
  CheckerInstanceSymbol *this_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  Symbol *in_RDI;
  LookupLocation LVar7;
  CheckerInstanceSymbol *instance;
  MemberSyntax *member;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::MemberSyntax> *__range2_1;
  Symbol *actualArg;
  ExpressionSyntax *outputInitialSyntax;
  AssertionPortSymbol *port;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL> connections;
  SyntaxNode *checkerSyntax;
  CheckerInstanceBodySymbol *body;
  ASTContext context;
  AssertionInstanceDetails *assertionDetails;
  Compilation *comp;
  Scope *scope;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::Symbol_*&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *this_01;
  Compilation *in_stack_fffffffffffffbb0;
  ASTContext *__args_1;
  ASTContext *in_stack_fffffffffffffbb8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffbc0;
  CheckerInstanceBodySymbol *in_stack_fffffffffffffbc8;
  CheckerInstanceBodySymbol *in_stack_fffffffffffffbd0;
  SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *in_stack_fffffffffffffbd8;
  CheckerInstanceBodySymbol *in_stack_fffffffffffffbe0;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  ASTContext *in_stack_fffffffffffffc00;
  AssertionInstanceDetails *in_stack_fffffffffffffc08;
  Symbol **__x;
  CheckerSymbol *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  uint in_stack_fffffffffffffc1c;
  Compilation *in_stack_fffffffffffffc20;
  CheckerInstanceBodySymbol *in_stack_fffffffffffffc28;
  AssertionPortSymbol *in_stack_fffffffffffffc30;
  Compilation *in_stack_fffffffffffffc38;
  Compilation *this_02;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_370;
  SyntaxList<slang::syntax::MemberSyntax> *local_368;
  undefined1 local_360 [40];
  RandomizeDetails *local_338;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> local_330 [5];
  Symbol *local_2e0;
  undefined8 local_2d8;
  AssertionPortSymbol *local_2d0;
  AssertionPortSymbol **local_2c8;
  __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
  local_2c0;
  SyntaxNode **local_2b8;
  SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> local_2b0;
  SyntaxNode *local_208;
  undefined1 local_1fa [2];
  CheckerInstanceBodySymbol *local_1f8;
  bitmask<slang::ast::ASTFlags> local_1f0;
  Scope *local_1e8;
  uint32_t local_1e0;
  Scope *local_1d8;
  uint32_t local_1d0;
  AssertionInstanceDetails *local_190;
  Compilation *local_188;
  Scope *local_180;
  Symbol *local_170;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_168;
  Symbol **local_160;
  flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_>
  *local_158;
  undefined1 local_149;
  undefined1 local_148 [39];
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  local_b0;
  CheckerInstanceBodySymbol *local_98;
  size_t local_90;
  Symbol **local_88;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_80;
  Symbol **local_78;
  undefined1 *local_70;
  Compilation *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  CheckerInstanceBodySymbol *local_18;
  Symbol **local_10;
  Compilation *local_8;
  
  local_170 = in_RDI;
  local_180 = Symbol::getParentScope(in_RDI);
  local_188 = Scope::getCompilation(local_180);
  local_190 = Compilation::allocAssertionDetails(in_stack_fffffffffffffbb0);
  local_190->symbol = local_170;
  local_190->instanceLoc = local_170->location;
  LVar7 = LookupLocation::after((Symbol *)in_stack_fffffffffffffbb0);
  local_1e8 = LVar7.scope;
  local_1e0 = LVar7.index;
  local_1d8 = local_1e8;
  local_1d0 = local_1e0;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_1f0,None);
  LVar7._8_8_ = in_stack_fffffffffffffbd0;
  LVar7.scope = (Scope *)in_stack_fffffffffffffbc8;
  ASTContext::ASTContext
            (in_stack_fffffffffffffbb8,(Scope *)in_stack_fffffffffffffbb0,LVar7,
             in_stack_fffffffffffffbc0);
  local_1fa[1] = 0;
  local_1fa[0] = 1;
  this_01 = (span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)
            (local_1fa + 1);
  __args_1 = (ASTContext *)local_1fa;
  local_1f8 = BumpAllocator::
              emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext&,unsigned_int&,bool,slang::ast::InstanceFlags>
                        (&in_stack_fffffffffffffc20->super_BumpAllocator,
                         (Compilation *)
                         CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                         in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         in_stack_fffffffffffffc00,
                         (uint *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                         (bool *)in_stack_fffffffffffffc30,
                         (InstanceFlags *)in_stack_fffffffffffffc38);
  local_208 = Symbol::getSyntax(local_170);
  Symbol::setSyntax(&local_1f8->super_Symbol,local_208);
  SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL>::SmallVector
            ((SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL> *)0xfce7b8);
  local_2b8 = &local_170[1].originatingSyntax;
  local_2c0._M_current =
       (AssertionPortSymbol **)
       std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::begin
                 (this_01);
  local_2c8 = (AssertionPortSymbol **)
              std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>
                          *)in_stack_fffffffffffffbb8);
  do {
    bVar3 = __gnu_cxx::
            operator==<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                        *)__args_1,
                       (__normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                        *)this_01);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      args = slang::syntax::SyntaxNode::as<slang::syntax::CheckerDeclarationSyntax>(local_208);
      local_368 = &args->members;
      local_370._M_current =
           (MemberSyntax **)
           std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)this_01);
      std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                 in_stack_fffffffffffffbb8);
      while (bVar3 = __gnu_cxx::
                     operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                 *)__args_1,
                                (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                 *)this_01), ((bVar3 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
        ::operator*(&local_370);
        Scope::addMembers((Scope *)connections.stackBase._8_8_,
                          (SyntaxNode *)connections.stackBase._0_8_);
        __gnu_cxx::
        __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
        ::operator++(&local_370);
      }
      this_00 = BumpAllocator::
                emplace<slang::ast::CheckerInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::CheckerInstanceBodySymbol&>
                          ((BumpAllocator *)in_stack_fffffffffffffbe0,
                           (basic_string_view<char,_std::char_traits<char>_> *)args,
                           (SourceLocation *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      Symbol::setSyntax((Symbol *)this_00,local_208);
      iVar4 = SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::copy
                        (&local_2b0,(EVP_PKEY_CTX *)local_188,src);
      (this_00->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
      (this_00->connections)._M_extent._M_extent_value = extraout_RDX;
      SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL>::~SmallVector
                ((SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL> *)0xfcf027);
      return this_00;
    }
    ppAVar5 = __gnu_cxx::
              __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_2c0);
    local_2d0 = *ppAVar5;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(local_2d0->super_Symbol).name);
    if (!bVar3) {
      local_2d8 = 0;
      local_2e0 = createCheckerFormal(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                                      in_stack_fffffffffffffc28,
                                      (ExpressionSyntax **)in_stack_fffffffffffffc20,
                                      (ASTContext *)
                                      CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18))
      ;
      in_stack_fffffffffffffc38 = (Compilation *)&local_190->argumentMap;
      local_338 = (RandomizeDetails *)0x0;
      std::make_tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext&>
                ((PropertyExprSyntax **)in_stack_fffffffffffffbb8,__args_1);
      local_160 = &local_2e0;
      local_168 = local_330;
      local_158 = (flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_>
                   *)in_stack_fffffffffffffc38;
      local_148._8_8_ = local_168;
      local_148._16_8_ = local_160;
      local_148._24_8_ = in_stack_fffffffffffffc38;
      paVar6 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                     *)0xfce951);
      in_stack_fffffffffffffc30 = (AssertionPortSymbol *)local_148;
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::Symbol_*&,_void>
      ::alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::Symbol_*&,_void>
                  *)in_stack_fffffffffffffc30,paVar6,(Symbol **)local_148._16_8_);
      local_78 = boost::unordered::detail::foa::
                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::Symbol_*&,_void>
                 ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::Symbol_*&,_void>
                                *)in_stack_fffffffffffffc30);
      local_70 = &local_149;
      local_80 = (span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)
                 local_148._8_8_;
      in_stack_fffffffffffffc20 = in_stack_fffffffffffffc38;
      local_68 = in_stack_fffffffffffffc38;
      local_88 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 ::
                 key_from<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                           (local_78,local_148._8_8_);
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 ::hash_for<slang::ast::Symbol_const*>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)__args_1,(Symbol **)this_01);
      in_stack_fffffffffffffc28 =
           (CheckerInstanceBodySymbol *)
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
           ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           *)__args_1,(size_t)this_01);
      local_10 = local_88;
      local_20 = local_90;
      this_02 = in_stack_fffffffffffffc20;
      local_98 = in_stack_fffffffffffffc28;
      local_18 = in_stack_fffffffffffffc28;
      local_8 = in_stack_fffffffffffffc20;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,(size_t)in_stack_fffffffffffffc28);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)0xfceac5);
        local_40 = local_40 + local_38;
        in_stack_fffffffffffffc1c =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match((group15<boost::unordered::detail::foa::plain_integral> *)
                   in_stack_fffffffffffffbb8,(size_t)__args_1);
        local_44 = in_stack_fffffffffffffc1c;
        if (in_stack_fffffffffffffc1c != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                 *)0xfceb1a);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           *)0xfceb6a);
            __x = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                  ::
                  key_from<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                            ((pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                              *)0xfceb98);
            bVar3 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this,__x,__y);
            if (bVar3) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_00fcec9f;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar3 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)__args_1,
                           (size_t)this_01);
        if (bVar3) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
          ::table_locator(&local_b0);
          goto LAB_00fcec9f;
        }
        bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,
                           (((table_type *)&in_stack_fffffffffffffc20->super_BumpAllocator)->
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           ).arrays.groups_size_mask);
      } while (bVar3);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
      ::table_locator(&local_b0);
LAB_00fcec9f:
      bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_b0);
      if (bVar3) {
        local_c0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::make_iterator((locator *)0xfcecc1);
        local_c1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)(local_360 + 0x10),&local_c0,&local_c1);
      }
      else {
        uVar1._0_4_ = (this_02->options).maxConstexprBacktrace;
        uVar1._4_4_ = (this_02->options).maxDefParamSteps;
        uVar2._0_4_ = (this_02->options).maxConstexprDepth;
        uVar2._4_4_ = (this_02->options).maxConstexprSteps;
        if (uVar1 < uVar2) {
          this_01 = local_80;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      *)in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8,
                     (size_t)in_stack_fffffffffffffbd0,
                     (try_emplace_args_t *)in_stack_fffffffffffffbc8,
                     (Symbol **)in_stack_fffffffffffffbc0.m_bits,in_stack_fffffffffffffbf0);
          local_d8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                     ::make_iterator((locator *)0xfced63);
          local_f1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)(local_360 + 0x10),&local_d8,local_f1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      *)this_02,(size_t)in_stack_fffffffffffffc38,
                     (try_emplace_args_t *)in_stack_fffffffffffffc30,
                     (Symbol **)in_stack_fffffffffffffc28,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     in_stack_fffffffffffffc20);
          local_108 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      ::make_iterator((locator *)0xfcedde);
          local_121[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)(local_360 + 0x10),&local_108,local_121);
        }
      }
      in_stack_fffffffffffffbf0 =
           (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)local_360;
      in_stack_fffffffffffffbe0 = local_1f8;
      std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::span
                ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)0xfcee45)
      ;
      SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
      emplace_back<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>
                (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                 &in_stack_fffffffffffffbc8->super_Symbol,
                 (ExpressionSyntax **)in_stack_fffffffffffffbc0.m_bits,
                 (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffbb8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_2c0);
  } while( true );
}

Assistant:

CheckerInstanceSymbol& CheckerInstanceSymbol::createInvalid(const CheckerSymbol& checker,
                                                            uint32_t depth) {
    auto scope = checker.getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    auto assertionDetails = comp.allocAssertionDetails();
    assertionDetails->symbol = &checker;
    assertionDetails->instanceLoc = checker.location;

    ASTContext context(*scope, LookupLocation::after(checker));
    auto body = comp.emplace<CheckerInstanceBodySymbol>(comp, checker, *assertionDetails, context,
                                                        depth,
                                                        /* isProcedural */ false,
                                                        InstanceFlags::Uninstantiated);

    auto checkerSyntax = checker.getSyntax();
    SLANG_ASSERT(checkerSyntax);
    body->setSyntax(*checkerSyntax);

    SmallVector<Connection> connections;
    for (auto port : checker.ports) {
        if (port->name.empty())
            continue;

        const ExpressionSyntax* outputInitialSyntax = nullptr;
        auto actualArg = createCheckerFormal(comp, *port, *body, outputInitialSyntax, context);

        assertionDetails->argumentMap.emplace(
            actualArg, std::make_tuple((const PropertyExprSyntax*)nullptr, context));
        connections.emplace_back(*body, *actualArg, outputInitialSyntax,
                                 std::span<const AttributeSymbol* const>{});
    }

    for (auto member : checkerSyntax->as<CheckerDeclarationSyntax>().members)
        body->addMembers(*member);

    auto instance = comp.emplace<CheckerInstanceSymbol>(checker.name, checker.location, *body);
    instance->setSyntax(*checkerSyntax);
    instance->connections = connections.copy(comp);
    return *instance;
}